

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  DeclaratorSyntax *args_6;
  FunctionPortSyntax *pFVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  Token local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x90) == (SyntaxNode *)0x0) {
    _visitor = (SyntaxNode *)0x0;
  }
  else {
    _visitor = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x90),&visitor,(BumpAllocator *)__child_stack);
  }
  args_6 = (DeclaratorSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x98),&visitor_1,(BumpAllocator *)__child_stack);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::FunctionPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::syntax::DeclaratorSyntax&>
                     ((BumpAllocator *)__child_stack,args,&local_30,&local_40,&local_50,&local_60,
                      (DataTypeSyntax **)&visitor,args_6);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const FunctionPortSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<FunctionPortSyntax>(
        *deepClone(node.attributes, alloc),
        node.constKeyword.deepClone(alloc),
        node.direction.deepClone(alloc),
        node.staticKeyword.deepClone(alloc),
        node.varKeyword.deepClone(alloc),
        node.dataType ? deepClone(*node.dataType, alloc) : nullptr,
        *deepClone<DeclaratorSyntax>(*node.declarator, alloc)
    );
}